

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_inquire_subgroups(char ***results,char *full_prefix,size_t *size,adios2_io *io)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  const_iterator cVar5;
  char **ppcVar6;
  void *pvVar7;
  _Base_ptr p_Var8;
  byte *__size;
  long *plVar9;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subGrpNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  size_t *local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_98;
  string local_90 [8];
  ulong local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,"for adios2_io, in call to adios2_inquire_all_variables",
             (allocator *)&local_d0);
  local_a0 = size;
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)adios2::core::IO::GetVariables_abi_cxx11_();
  lVar2 = adios2::core::IO::GetAttributes_abi_cxx11_();
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar3 = strlen(full_prefix);
  p_Var10 = p_Var1 + 0x10;
  local_98 = p_Var1;
  while (p_Var10 = *(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     **)p_Var10,
        p_Var10 !=
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
    std::__cxx11::string::string(local_90,(string *)(p_Var10 + 8));
    if (sVar3 < local_88) {
      lVar4 = std::__cxx11::string::find((char *)local_90,(ulong)full_prefix);
      if (lVar4 == 0) {
        lVar4 = std::__cxx11::string::find((char *)local_90,0x128767);
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)local_90);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_d0,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
    }
    std::__cxx11::string::~string(local_90);
  }
  plVar9 = (long *)(lVar2 + 0x10);
  while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
    std::__cxx11::string::string(local_90,(string *)(plVar9 + 1));
    if (sVar3 < local_88) {
      lVar2 = std::__cxx11::string::find((char *)local_90,(ulong)full_prefix);
      if (lVar2 == 0) {
        lVar2 = std::__cxx11::string::find((char *)local_90,0x128767);
        if (lVar2 != -1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)local_90);
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_98,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)local_90);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_d0,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_90);
  }
  *local_a0 = local_d0._M_impl.super__Rb_tree_header._M_node_count;
  ppcVar6 = (char **)malloc(local_d0._M_impl.super__Rb_tree_header._M_node_count << 3);
  *results = ppcVar6;
  lVar2 = 0;
  p_Var8 = local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var8 != &local_d0._M_impl.super__Rb_tree_header) {
    __size = (byte *)((long)&(p_Var8[1]._M_parent)->_M_color + 1);
    pvVar7 = malloc((size_t)__size);
    *(void **)((long)*results + lVar2) = pvVar7;
    snprintf(*(char **)((long)*results + lVar2),(size_t)__size,"%s",*(undefined8 *)(p_Var8 + 1));
    *(undefined1 *)((long)&(p_Var8[1]._M_parent)->_M_color + *(long *)((long)*results + lVar2)) = 0;
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    lVar2 = lVar2 + 8;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d0);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_inquire_subgroups(char ***results, const char *full_prefix, size_t *size,
                                      adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_variables");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMapVar = ioCpp.GetVariables();
        const auto &dataMapAttr = ioCpp.GetAttributes();

        std::set<std::string> subGrpNames;
        size_t prefix_size = strlen(full_prefix);

        for (auto &it : dataMapVar)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.find("/", prefix_size + 1);
                if (pos != std::string::npos)
                    subGrpNames.insert(curr.substr(prefix_size, pos - prefix_size));
            }
        }

        for (auto &it : dataMapAttr)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.find("/", prefix_size + 1);
                if (pos != std::string::npos)
                {
                    auto hasVar = dataMapVar.find(curr.substr(0, pos));
                    if (hasVar == dataMapVar.end())
                        subGrpNames.insert(curr.substr(prefix_size, pos - prefix_size));
                    // else
                    // std::cout<<" .. found a variable! "<<curr<<std::endl;
                }
            }
        }

        *size = subGrpNames.size();
        *results = (char **)malloc(sizeof(char *) * (*size));

        // std::cout<<" subgroup of: "<<full_prefix<<std::endl;
        int i = 0;
        for (auto &m : subGrpNames)
        {
            (*results)[i] = (char *)malloc(m.size() + 1);
            snprintf((*results)[i], m.size() + 1, "%s", m.c_str());
            (*results)[i][m.size()] = '\0';
            i++;
        }

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_variables"));
    }
}